

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *dctx,void *src,size_t srcSize)

{
  HUF_DTable *dctx_00;
  BYTE *pBVar1;
  int bmi2;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong cSrcSize;
  ulong uVar7;
  byte bVar8;
  size_t __n;
  size_t sVar9;
  ulong dstSize;
  bool bVar10;
  
  uVar7 = 0xffffffffffffffec;
  if (srcSize < 3) {
    return 0xffffffffffffffec;
  }
  bVar8 = *src;
  bVar2 = bVar8 & 3;
  switch(bVar2) {
  case 0:
    bVar2 = bVar8 >> 2 & 3;
    if (bVar2 == 1) {
      __n = (size_t)(*src >> 4);
      lVar6 = 2;
    }
    else if (bVar2 == 3) {
      __n = (size_t)(*src >> 4);
      lVar6 = 3;
    }
    else {
      __n = (size_t)(bVar8 >> 3);
      lVar6 = 1;
    }
    uVar7 = lVar6 + __n;
    if (srcSize < lVar6 + __n + 8) {
      if (srcSize < uVar7) {
        return 0xffffffffffffffec;
      }
      memcpy(dctx->litBuffer,(void *)((long)src + lVar6),__n);
      dctx->litPtr = dctx->litBuffer;
      dctx->litSize = __n;
      pBVar1 = dctx->litBuffer + __n;
      pBVar1[0] = '\0';
      pBVar1[1] = '\0';
      pBVar1[2] = '\0';
      pBVar1[3] = '\0';
      pBVar1[4] = '\0';
      pBVar1[5] = '\0';
      pBVar1[6] = '\0';
      pBVar1[7] = '\0';
      return uVar7;
    }
    dctx->litPtr = (BYTE *)((long)src + lVar6);
    dctx->litSize = __n;
    return uVar7;
  case 1:
    bVar2 = bVar8 >> 2 & 3;
    if (bVar2 == 1) {
      sVar9 = (size_t)(*src >> 4);
      lVar6 = 2;
    }
    else if (bVar2 == 3) {
      if (srcSize == 3) {
        return 0xffffffffffffffec;
      }
      sVar9 = (size_t)(*src >> 4);
      lVar6 = 3;
    }
    else {
      sVar9 = (size_t)(bVar8 >> 3);
      lVar6 = 1;
    }
    if (0x20000 < (uint)sVar9) {
      return 0xffffffffffffffec;
    }
    memset(dctx->litBuffer,(uint)*(byte *)((long)src + lVar6),sVar9 + 8);
    dctx->litPtr = dctx->litBuffer;
    dctx->litSize = sVar9;
    return lVar6 + 1;
  case 3:
    if (dctx->litEntropy == 0) {
      return 0xffffffffffffffe2;
    }
  }
  if (srcSize < 5) {
    return 0xffffffffffffffec;
  }
  bVar8 = bVar8 >> 2 & 3;
  uVar3 = *src;
  if (bVar8 == 2) {
    uVar5 = uVar3 >> 4 & 0x3fff;
    uVar3 = uVar3 >> 0x12;
    lVar6 = 4;
  }
  else {
    if (bVar8 != 3) {
      bVar10 = bVar8 != 0;
      uVar5 = uVar3 >> 4 & 0x3ff;
      uVar3 = uVar3 >> 0xe & 0x3ff;
      lVar6 = 3;
      goto LAB_0014e23f;
    }
    uVar5 = uVar3 >> 4 & 0x3ffff;
    uVar3 = uVar3 >> 0x16 | (uint)*(byte *)((long)src + 4) << 10;
    lVar6 = 5;
  }
  bVar10 = true;
LAB_0014e23f:
  if (uVar5 < 0x20001) {
    cSrcSize = (ulong)uVar3;
    if (lVar6 + cSrcSize <= srcSize) {
      dstSize = (ulong)uVar5;
      if ((0x300 < uVar5) && (dctx->ddictIsCold != 0)) {
        uVar4 = 0xffffffffffffffc0;
        do {
          uVar4 = uVar4 + 0x40;
        } while (uVar4 < 0x3fc4);
      }
      bmi2 = dctx->bmi2;
      if (bVar2 == 3) {
        if (bVar10) {
          uVar4 = HUF_decompress4X_usingDTable_bmi2
                            (dctx->litBuffer,dstSize,(void *)((long)src + lVar6),cSrcSize,
                             dctx->HUFptr,bmi2);
        }
        else {
          uVar4 = HUF_decompress1X_usingDTable_bmi2
                            (dctx->litBuffer,dstSize,(void *)((long)src + lVar6),cSrcSize,
                             dctx->HUFptr,bmi2);
        }
      }
      else {
        dctx_00 = (dctx->entropy).hufTable;
        if (bVar10) {
          uVar4 = HUF_decompress4X_hufOnly_wksp_bmi2
                            (dctx_00,dctx->litBuffer,dstSize,(void *)((long)src + lVar6),cSrcSize,
                             dctx->workspace,0x800,bmi2);
        }
        else {
          uVar4 = HUF_decompress1X1_DCtx_wksp_bmi2
                            (dctx_00,dctx->litBuffer,dstSize,(void *)((long)src + lVar6),cSrcSize,
                             dctx->workspace,0x800,bmi2);
        }
      }
      if (uVar4 < 0xffffffffffffff89) {
        dctx->litPtr = dctx->litBuffer;
        dctx->litSize = dstSize;
        dctx->litEntropy = 1;
        if (bVar2 == 2) {
          dctx->HUFptr = (dctx->entropy).hufTable;
        }
        pBVar1 = dctx->litBuffer + dstSize;
        pBVar1[0] = '\0';
        pBVar1[1] = '\0';
        pBVar1[2] = '\0';
        pBVar1[3] = '\0';
        pBVar1[4] = '\0';
        pBVar1[5] = '\0';
        pBVar1[6] = '\0';
        pBVar1[7] = '\0';
        uVar7 = lVar6 + cSrcSize;
      }
    }
  }
  return uVar7;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize)   /* note : srcSize < BLOCKSIZE */
{
    RETURN_ERROR_IF(srcSize < MIN_CBLOCK_SIZE, corruption_detected);

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            RETURN_ERROR_IF(dctx->litEntropy==0, dictionary_corrupted);
            /* fall-through */

        case set_compressed:
            RETURN_ERROR_IF(srcSize < 5, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 3; here we need up to 5 for case 3");
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                size_t hufSuccess;
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + (istart[4] << 10);
                    break;
                }
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected);
                RETURN_ERROR_IF(litCSize + lhSize > srcSize, corruption_detected);

                /* prefetch huffman table if cold */
                if (dctx->ddictIsCold && (litSize > 768 /* heuristic */)) {
                    PREFETCH_AREA(dctx->HUFptr, sizeof(dctx->entropy.hufTable));
                }

                if (litEncType==set_repeat) {
                    if (singleStream) {
                        hufSuccess = HUF_decompress1X_usingDTable_bmi2(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, dctx->bmi2);
                    } else {
                        hufSuccess = HUF_decompress4X_usingDTable_bmi2(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, dctx->bmi2);
                    }
                } else {
                    if (singleStream) {
#if defined(HUF_FORCE_DECOMPRESS_X2)
                        hufSuccess = HUF_decompress1X_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace));
#else
                        hufSuccess = HUF_decompress1X1_DCtx_wksp_bmi2(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), dctx->bmi2);
#endif
                    } else {
                        hufSuccess = HUF_decompress4X_hufOnly_wksp_bmi2(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), dctx->bmi2);
                    }
                }

                RETURN_ERROR_IF(HUF_isError(hufSuccess), corruption_detected);

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    RETURN_ERROR_IF(litSize+lhSize > srcSize, corruption_detected);
                    memcpy(dctx->litBuffer, istart+lhSize, litSize);
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    RETURN_ERROR_IF(srcSize<4, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 3; here we need lhSize+1 = 4");
                    break;
                }
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected);
                memset(dctx->litBuffer, istart[lhSize], litSize + WILDCOPY_OVERLENGTH);
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            RETURN_ERROR(corruption_detected, "impossible");
        }
    }
}